

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::AddWrap
               (TPZMultiphysicsElement *mfcel,int matskeleton,
               TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10> *ListGroupEl)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  uint order;
  undefined4 uVar6;
  long lVar7;
  long *plVar8;
  TPZGeoEl *pTVar9;
  TPZCompMesh *pTVar10;
  TPZCompMesh *this;
  TPZStack<TPZMultiphysicsElement_*,_7> *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  size_t in_stack_00000128;
  char *in_stack_00000130;
  TPZInterpolationSpace *contcel;
  TPZCompElDisc *discel;
  TPZMultiphysicsElement *locMF;
  TPZCompEl *newMFBound;
  TPZConnect *co;
  int64_t sideconnectindex;
  TPZCompElHDivBound2<pzshape::TPZShapeQuad> *hdivbound_2;
  int sideorient_2;
  TPZCompElHDivBound2<pzshape::TPZShapeTriang> *hdivbound_1;
  int sideorient_1;
  TPZCompElHDivBound2<pzshape::TPZShapeLinear> *hdivbound;
  int sideorient;
  MElementType elType;
  TPZInterpolationSpace *bound;
  int sideorder;
  TPZConnect *conside;
  int loccon;
  TPZInterpolationSpace *intel;
  TPZGeoEl *gelbound;
  int side;
  TPZStack<TPZMultiphysicsElement_*,_7> wrapEl;
  int dimMesh;
  TPZGeoEl *gel;
  MElementType celType;
  TPZCompEl *cel;
  TPZInterpolationSpace *hdivel;
  TPZCompMesh *multiMesh;
  TPZMultiphysicsElement *in_stack_fffffffffffffd08;
  TPZCompMesh *in_stack_fffffffffffffd10;
  TPZCompEl *in_stack_fffffffffffffd18;
  TPZStack<TPZMultiphysicsElement_*,_7> *in_stack_fffffffffffffd20;
  TPZCompEl *local_2c8;
  long *local_2b8;
  TPZCompEl *in_stack_fffffffffffffd78;
  TPZGeoEl *in_stack_fffffffffffffd80;
  long *local_260;
  long *in_stack_fffffffffffffdc8;
  TPZGeoEl *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  TPZCompMesh *in_stack_fffffffffffffde0;
  HDivFamily hdivfam;
  undefined7 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  long *local_1c8;
  TPZCompElSide local_160;
  TPZCompEl *local_150;
  TPZCompElSide local_148;
  TPZCompEl *local_138;
  long *local_130;
  TPZCompEl *local_128;
  TPZConnect *local_120;
  undefined8 local_118;
  TPZCompEl *in_stack_fffffffffffffef0;
  TPZGeoEl *local_e0;
  int local_b0;
  
  TPZCompEl::Mesh(in_stack_fffffffffffffef0);
  lVar7 = (**(code **)(*in_RDI + 600))(in_RDI,0);
  if (lVar7 == 0) {
    local_1c8 = (long *)0x0;
  }
  else {
    local_1c8 = (long *)__dynamic_cast(lVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0
                                      );
  }
  plVar8 = (long *)(**(code **)(*in_RDI + 600))(in_RDI,1);
  iVar2 = (**(code **)(*plVar8 + 0x78))();
  pTVar9 = TPZCompEl::Reference(in_stack_fffffffffffffd18);
  pTVar10 = TPZCompEl::Mesh(in_stack_fffffffffffffef0);
  iVar3 = TPZCompMesh::Dimension(pTVar10);
  if (((local_1c8 == (long *)0x0) || (plVar8 == (long *)0x0)) ||
     (iVar4 = (**(code **)(*(long *)pTVar9 + 0x210))(), iVar4 != iVar3)) {
    pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
  }
  TPZStack<TPZMultiphysicsElement_*,_7>::TPZStack(in_stack_fffffffffffffd20);
  TPZStack<TPZMultiphysicsElement_*,_7>::push_back
            ((TPZStack<TPZMultiphysicsElement_*,_7> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  for (local_b0 = 0; iVar3 = (**(code **)(*(long *)pTVar9 + 0xf0))(), local_b0 < iVar3;
      local_b0 = local_b0 + 1) {
    iVar3 = (**(code **)(*(long *)pTVar9 + 0x208))(pTVar9,local_b0);
    iVar4 = (**(code **)(*(long *)pTVar9 + 0x210))();
    if (iVar3 == iVar4 + -1) {
      (**(code **)(*(long *)pTVar9 + 0x170))(pTVar9,local_b0,in_ESI);
      uVar5 = (**(code **)(*local_1c8 + 0x250))(local_1c8,0,local_b0);
      uVar6 = uVar5;
      pTVar10 = (TPZCompMesh *)(**(code **)(*local_1c8 + 0xa8))(local_1c8,uVar5);
      bVar1 = TPZConnect::Order((TPZConnect *)pTVar10);
      order = (uint)bVar1;
      this = TPZCompEl::Mesh(in_stack_fffffffffffffef0);
      TPZCompMesh::SetDefaultOrder(this,order);
      hdivfam = (HDivFamily)((ulong)this >> 0x20);
      iVar3 = (**(code **)(*(long *)pTVar9 + 0xc0))(pTVar9,local_b0);
      if (iVar3 == 1) {
        local_e0 = (TPZGeoEl *)operator_new(0x80);
        in_stack_fffffffffffffde0 = TPZCompEl::Mesh(in_stack_fffffffffffffef0);
        TPZCompElHDivBound2<pzshape::TPZShapeLinear>::TPZCompElHDivBound2
                  ((TPZCompElHDivBound2<pzshape::TPZShapeLinear> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffe10),pTVar10,
                   (TPZGeoEl *)CONCAT17(bVar1,in_stack_fffffffffffffe00),hdivfam);
        uVar6 = (**(code **)(*local_1c8 + 0x2f0))(local_1c8,local_b0);
        in_stack_fffffffffffffdd0 = local_e0;
        in_stack_fffffffffffffddc = uVar6;
        if (local_e0 == (TPZGeoEl *)0x0) {
          in_stack_fffffffffffffdc8 = (long *)0x0;
        }
        else {
          in_stack_fffffffffffffdc8 =
               (long *)__dynamic_cast(local_e0,&TPZInterpolationSpace::typeinfo,
                                      &TPZCompElHDivBound2<pzshape::TPZShapeLinear>::typeinfo,0);
        }
        (**(code **)(*in_stack_fffffffffffffdc8 + 0x2f8))(in_stack_fffffffffffffdc8,2,uVar6);
      }
      else if (iVar3 == 2) {
        local_e0 = (TPZGeoEl *)operator_new(0x80);
        TPZCompEl::Mesh(in_stack_fffffffffffffef0);
        TPZCompElHDivBound2<pzshape::TPZShapeTriang>::TPZCompElHDivBound2
                  ((TPZCompElHDivBound2<pzshape::TPZShapeTriang> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffe10),pTVar10,
                   (TPZGeoEl *)CONCAT17(bVar1,in_stack_fffffffffffffe00),hdivfam);
        uVar6 = (**(code **)(*local_1c8 + 0x2f0))(local_1c8,local_b0);
        if (local_e0 == (TPZGeoEl *)0x0) {
          local_260 = (long *)0x0;
        }
        else {
          local_260 = (long *)__dynamic_cast(local_e0,&TPZInterpolationSpace::typeinfo,
                                             &TPZCompElHDivBound2<pzshape::TPZShapeTriang>::typeinfo
                                             ,0);
        }
        (**(code **)(*local_260 + 0x2f8))(local_260,6,uVar6);
      }
      else if (iVar3 == 3) {
        local_e0 = (TPZGeoEl *)operator_new(0x88);
        TPZCompEl::Mesh(in_stack_fffffffffffffef0);
        TPZCompElHDivBound2<pzshape::TPZShapeQuad>::TPZCompElHDivBound2
                  ((TPZCompElHDivBound2<pzshape::TPZShapeQuad> *)in_stack_fffffffffffffde0,
                   (TPZCompMesh *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0,(HDivFamily)((ulong)in_stack_fffffffffffffdc8 >> 0x20))
        ;
        uVar6 = (**(code **)(*local_1c8 + 0x2f0))(local_1c8,local_b0);
        in_stack_fffffffffffffd80 = local_e0;
        if (local_e0 == (TPZGeoEl *)0x0) {
          in_stack_fffffffffffffd78 = (TPZCompEl *)0x0;
        }
        else {
          in_stack_fffffffffffffd78 =
               (TPZCompEl *)
               __dynamic_cast(local_e0,&TPZInterpolationSpace::typeinfo,
                              &TPZCompElHDivBound2<pzshape::TPZShapeQuad>::typeinfo,0);
        }
        in_stack_fffffffffffffef0 = in_stack_fffffffffffffd78;
        (**(code **)(*(long *)in_stack_fffffffffffffd78 + 0x2f8))(in_stack_fffffffffffffd78,8,uVar6)
        ;
      }
      else {
        local_e0 = (TPZGeoEl *)0x0;
        std::operator<<((ostream *)&std::cout,"ElementType not found!");
        pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
      }
      local_118 = (**(code **)(*local_1c8 + 0xa0))(local_1c8,uVar5);
      local_120 = (TPZConnect *)(**(code **)(*(long *)local_e0 + 0xa8))(local_e0,0);
      iVar3 = TPZConnect::HasDependency(local_120);
      if (iVar3 != 0) {
        iVar3 = (**(code **)(*(long *)local_e0 + 0x90))();
        if (iVar3 != 1) {
          pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
        }
        TPZConnect::RemoveDepend((TPZConnect *)in_stack_fffffffffffffd10);
      }
      (**(code **)(*(long *)local_e0 + 0x208))(local_e0,0,local_118);
      local_128 = TPZCompMesh::CreateCompEl
                            (in_stack_fffffffffffffd10,(TPZGeoEl *)in_stack_fffffffffffffd08);
      if (local_128 == (TPZCompEl *)0x0) {
        local_2b8 = (long *)0x0;
      }
      else {
        local_2b8 = (long *)__dynamic_cast(local_128,&TPZCompEl::typeinfo,
                                           &TPZMultiphysicsElement::typeinfo,0);
      }
      local_130 = local_2b8;
      (**(code **)(*local_2b8 + 0x248))(local_2b8,local_e0,0);
      if (iVar2 == 0xf) {
        lVar7 = (**(code **)(*in_RDI + 600))(in_RDI,1);
        if (lVar7 == 0) {
          local_2c8 = (TPZCompEl *)0x0;
        }
        else {
          local_2c8 = (TPZCompEl *)
                      __dynamic_cast(lVar7,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
        }
        plVar8 = local_130;
        local_138 = local_2c8;
        TPZCompElSide::TPZCompElSide(&local_148,local_2c8,local_b0);
        (**(code **)(*plVar8 + 0x250))(plVar8,&local_148,1);
      }
      else {
        lVar7 = (**(code **)(*in_RDI + 600))(in_RDI,1);
        if (lVar7 == 0) {
          local_150 = (TPZCompEl *)0x0;
        }
        else {
          local_150 = (TPZCompEl *)
                      __dynamic_cast(lVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
        }
        plVar8 = local_130;
        TPZCompElSide::TPZCompElSide(&local_160,local_150,local_b0);
        (**(code **)(*plVar8 + 0x250))(plVar8,&local_160,1);
      }
      TPZStack<TPZMultiphysicsElement_*,_7>::push_back
                ((TPZStack<TPZMultiphysicsElement_*,_7> *)in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08);
    }
  }
  TPZStack<TPZMultiphysicsElement_*,_7>::TPZStack
            (in_RDX,(TPZStack<TPZMultiphysicsElement_*,_7> *)in_stack_fffffffffffffd08);
  TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10>::push_back
            ((TPZStack<TPZStack<TPZMultiphysicsElement_*,_7>,_10> *)in_stack_fffffffffffffd80,
             (TPZStack<TPZMultiphysicsElement_*,_7> *)in_stack_fffffffffffffd78);
  TPZStack<TPZMultiphysicsElement_*,_7>::~TPZStack
            ((TPZStack<TPZMultiphysicsElement_*,_7> *)0x1e417b4);
  TPZStack<TPZMultiphysicsElement_*,_7>::~TPZStack
            ((TPZStack<TPZMultiphysicsElement_*,_7> *)0x1e417c1);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::AddWrap(TPZMultiphysicsElement *mfcel, int matskeleton, TPZStack< TPZStack<TPZMultiphysicsElement *,7> > &ListGroupEl)
{
    TPZCompMesh *multiMesh = mfcel->Mesh();
    TPZInterpolationSpace *hdivel = dynamic_cast<TPZInterpolationSpace *> (mfcel->Element(0));
    TPZCompEl *cel = dynamic_cast<TPZCompEl *>(mfcel->Element(1));
    MElementType celType = cel->Type();
    
    TPZGeoEl *gel = mfcel->Reference();
    
    int dimMesh = mfcel->Mesh()->Dimension();
    if (!hdivel || !cel || gel->Dimension() != dimMesh) {
        DebugStop();
    }
    
    //wrap element
    TPZStack<TPZMultiphysicsElement *, 7> wrapEl;
    wrapEl.push_back(mfcel);
    
    for (int side = 0; side < gel->NSides(); side++)
    {
        if (gel->SideDimension(side) != gel->Dimension()-1) {
            continue;
        }
        TPZGeoEl *gelbound = gel->CreateBCGeoEl(side, matskeleton);
        TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(hdivel);
        int loccon = intel->SideConnectLocId(0,side);
        
        //Impose that the skeleton element has the same polynomial order  to the element of side.
        TPZConnect &conside = intel->Connect(loccon);
        int sideorder = conside.Order();
        intel->Mesh()->SetDefaultOrder(sideorder);
                
        TPZInterpolationSpace *bound;
        MElementType elType = gel->Type(side);
        switch(elType)
        {
            case(EOned)://line
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeLinear>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeLinear> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeLinear> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeLinear::NSides-1,sideorient);
                break;
            }
            case(ETriangle)://triangle
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeTriang>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeTriang> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeTriang> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeTriang::NSides-1,sideorient);
                break;
            }
            case(EQuadrilateral)://quadrilateral
            {
                bound = new TPZCompElHDivBound2<pzshape::TPZShapeQuad>(* intel->Mesh(),gelbound);
                int sideorient = intel->GetSideOrient(side);
                TPZCompElHDivBound2<pzshape::TPZShapeQuad> *hdivbound = dynamic_cast< TPZCompElHDivBound2<pzshape::TPZShapeQuad> *>(bound);
                hdivbound->SetSideOrient(pzshape::TPZShapeQuad::NSides-1,sideorient);
                break;
            }
                
            default:
            {
                bound=0;
                std::cout << "ElementType not found!";
                DebugStop();
                break;
            }
        }
        
        int64_t sideconnectindex = intel->ConnectIndex(loccon);
        
        TPZConnect &co = bound->Connect(0);
        if(co.HasDependency()){
            if(bound->NConnects()!=1) DebugStop();
            //int64_t cindex_bound = bound->ConnectIndex(0);
            co.RemoveDepend();
        }
        bound->SetConnectIndex(0, sideconnectindex);
        //bound->Print(std::cout);
        
        TPZCompEl *newMFBound = multiMesh->CreateCompEl(gelbound);
        TPZMultiphysicsElement *locMF = dynamic_cast<TPZMultiphysicsElement *>(newMFBound);
        
        locMF->AddElement(bound, 0);
        //locMF->Print(std::cout);
        
        if(celType==EDiscontinuous){
            TPZCompElDisc *discel = dynamic_cast<TPZCompElDisc *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(discel,side), 1);
        }else{
            TPZInterpolationSpace *contcel = dynamic_cast<TPZInterpolationSpace *>(mfcel->Element(1));
            locMF->AddElement(TPZCompElSide(contcel,side), 1);
        }
        
        wrapEl.push_back(locMF);
    }
    
    ListGroupEl.push_back(wrapEl);
}